

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SubstHelper.hpp
# Opt level: O1

Term * Kernel::SubstHelper::
       applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::DerefApplicator>
                 (Term *trm,DerefApplicator *applicator,bool noSharing)

{
  TermList **ppTVar1;
  TermList ***pppTVar2;
  Term ***pppTVar3;
  uint uVar4;
  bool *pbVar5;
  TermList **ppTVar6;
  Term **ppTVar7;
  Self SVar8;
  size_t sVar9;
  Self SVar10;
  uint uVar11;
  TermList *pTVar12;
  Term *pTVar13;
  TermList TVar14;
  Entry *pEVar15;
  Term *pTVar16;
  Formula *formula;
  long lVar17;
  Literal *lit;
  ulong uVar18;
  Stack<Kernel::TermList_*> *pSVar19;
  Self SVar20;
  ulong uVar21;
  bool bVar22;
  Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> args;
  Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> modified;
  Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> toDo;
  Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> terms;
  Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_80;
  Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_70;
  DArray<Kernel::TermList> local_60;
  Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> local_48;
  TermList local_38;
  
  uVar11 = trm->_functor;
  if (0xfffffff8 < uVar11) {
    uVar4 = (&switchD_0031e6d5::switchdataD_008f6d88)[~uVar11];
    switch(uVar11) {
    case 0xfffffffa:
      ::Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      ~Recycled(&local_80);
      ::Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::~Recycled
                (&local_70);
      ::Lib::Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      ~Recycled(&local_48);
      ::Lib::Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
      ~Recycled((Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>
                 *)&local_60);
      _Unwind_Resume((long)&switchD_0031e6d5::switchdataD_008f6d88 + (long)(int)uVar4);
    case 0xfffffffb:
      applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::DerefApplicator>
                ((TermList)*(uint64_t *)&trm[-1]._maxRedLen,applicator,noSharing);
      applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::DerefApplicator>
                ((TermList)trm->_args[*(uint *)&trm->field_0xc & 0xfffffff]._content,applicator,
                 noSharing);
      pTVar16 = (Term *)(*(code *)(&DAT_008f6dc0 +
                                  *(int *)(&DAT_008f6dc0 + (ulong)~trm->_functor * 4)))();
      return pTVar16;
    case 0xfffffffc:
      pTVar16 = applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::DerefApplicator>
                          (*(Term **)&trm[-1]._functor,applicator,noSharing);
      pTVar16 = Term::createTuple(pTVar16);
      return pTVar16;
    case 0xfffffffd:
      formula = applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::DerefApplicator>
                          (*(Formula **)&trm[-1]._functor,applicator,noSharing);
      pTVar16 = Term::createFormula(formula);
      return pTVar16;
    case 0xfffffffe:
      applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::DerefApplicator>
                ((TermList)*(uint64_t *)&trm[-1]._maxRedLen,applicator,noSharing);
      applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::DerefApplicator>
                ((TermList)trm->_args[*(uint *)&trm->field_0xc & 0xfffffff]._content,applicator,
                 noSharing);
      pTVar16 = (Term *)(*(code *)(&DAT_008f6ddc +
                                  *(int *)(&DAT_008f6ddc + (ulong)~trm->_functor * 4)))();
      return pTVar16;
    case 0xffffffff:
      applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::DerefApplicator>
                (*(Formula **)&trm[-1]._functor,applicator,noSharing);
      applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::DerefApplicator>
                ((TermList)trm->_args[*(uint *)&trm->field_0xc & 0xfffffff]._content,applicator,
                 noSharing);
      applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::DerefApplicator>
                ((TermList)trm->_args[(ulong)(*(uint *)&trm->field_0xc & 0xfffffff) - 1]._content,
                 applicator,noSharing);
      pTVar16 = (Term *)(*(code *)(&DAT_008f6df8 +
                                  *(int *)(&DAT_008f6df8 + (ulong)~trm->_functor * 4)))();
      return pTVar16;
    }
    ::Lib::DArray<Kernel::TermList>::DArray(&local_60,(ulong)(*(uint *)&trm->field_0xc & 0xfffffff))
    ;
    uVar11 = *(uint *)&trm->field_0xc & 0xfffffff;
    uVar18 = (ulong)uVar11;
    if (uVar11 != 0) {
      lVar17 = 0;
      uVar21 = 0;
      do {
        TVar14 = applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::DerefApplicator>
                           (trm->_args[uVar18 + lVar17]._content,applicator,noSharing);
        local_60._array[uVar21]._content = TVar14._content;
        uVar21 = uVar21 + 1;
        uVar18 = (ulong)(*(uint *)&trm->field_0xc & 0xfffffff);
        lVar17 = lVar17 + -1;
      } while (uVar21 < uVar18);
    }
    pTVar16 = (Term *)(*(code *)(&DAT_008f6da4 + *(int *)(&DAT_008f6da4 + (ulong)~trm->_functor * 4)
                                ))();
    return pTVar16;
  }
  ::Lib::Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled((Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *)
           &local_60);
  ::Lib::Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
            (&local_48);
  ::Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::Recycled
            (&local_70);
  ::Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  Recycled(&local_80);
  SVar8._M_t.super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>._M_t.
  super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>.
  super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl =
       local_70._self._M_t.
       super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>._M_t.
       super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>.
       super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl;
  if (*(bool **)((long)local_70._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                       .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10) ==
      *(bool **)((long)local_70._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                       .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x18)) {
    ::Lib::Stack<bool>::expand
              ((Stack<bool> *)
               local_70._self._M_t.
               super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>._M_t
               .super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>.
               super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl);
  }
  pSVar19 = (Stack<Kernel::TermList_*> *)local_60._size;
  pbVar5 = *(bool **)((long)SVar8._M_t.
                            super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                            ._M_t.
                            super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                            .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10);
  *pbVar5 = false;
  *(bool **)((long)SVar8._M_t.
                   super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                   .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10) =
       pbVar5 + 1;
  uVar11 = *(uint *)&trm->field_0xc;
  if (*(TermList ***)(local_60._size + 0x10) == *(TermList ***)(local_60._size + 0x18)) {
    ::Lib::Stack<Kernel::TermList_*>::expand((Stack<Kernel::TermList_*> *)local_60._size);
  }
  pTVar12 = trm->_args + (uVar11 & 0xfffffff);
  do {
    *pSVar19->_cursor = pTVar12;
    pSVar19->_cursor = pSVar19->_cursor + 1;
LAB_0031e7d0:
    sVar9 = local_60._size;
    SVar20._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl =
         (__uniq_ptr_data<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>,_true,_true>
          )(__uniq_ptr_data<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>,_true,_true>
            )local_80._self;
    ppTVar6 = *(TermList ***)(local_60._size + 0x10);
    ppTVar1 = ppTVar6 + -1;
    *(TermList ***)(local_60._size + 0x10) = ppTVar1;
    pTVar12 = ppTVar6[-1];
    if ((pTVar12->_content & 3) == 2) {
      ppTVar7 = *(Term ***)
                 ((long)local_48._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl +
                 0x10);
      if (ppTVar7 ==
          *(Term ***)
           ((long)local_48._self._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl + 8)) {
        pbVar5 = *(bool **)((long)local_70._self._M_t.
                                  super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                                  .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl +
                           0x10);
        *(bool **)((long)local_70._self._M_t.
                         super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                         .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10) =
             pbVar5 + -1;
        if (pbVar5[-1] != true) goto LAB_0031ed61;
        uVar11 = *(uint *)&trm->field_0xc & 0xfffffff;
        pTVar12 = *(TermList **)
                   ((long)local_80._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl
                   + 0x10) + (-1 - (ulong)(uVar11 - 1));
        uVar18 = trm->_args[0]._content;
        if ((uVar18 & 0x10) != 0) {
          trm = &Literal::create((Literal *)trm,pTVar12)->super_Term;
          goto LAB_0031ed61;
        }
        if ((uVar18 & 0x20) != 0) {
          trm = &AtomicSort::create((AtomicSort *)trm,pTVar12)->super_Term;
          goto LAB_0031ed61;
        }
        if (noSharing) goto LAB_0031ed56;
        bVar22 = uVar11 == 0;
        if (bVar22) goto LAB_0031ebb9;
        lVar17 = 0;
        break;
      }
      *(Term ***)
       ((long)local_48._self._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl + 0x10) =
           ppTVar7 + -1;
      pTVar16 = ppTVar7[-1];
      pbVar5 = *(bool **)((long)local_70._self._M_t.
                                super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                                .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl +
                         0x10);
      *(bool **)((long)local_70._self._M_t.
                       super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                       ._M_t.
                       super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                       .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10) =
           pbVar5 + -1;
      if (pbVar5[-1] != false) {
        uVar11 = *(uint *)&pTVar16->field_0xc & 0xfffffff;
        pTVar12 = *(TermList **)
                   ((long)local_80._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl
                   + 0x10) + (-1 - (ulong)(uVar11 - 1));
        if (noSharing) {
LAB_0031e96a:
          pTVar13 = Term::createNonShared(pTVar16,pTVar12);
        }
        else {
          bVar22 = uVar11 == 0;
          if (!bVar22) {
            lVar17 = 0;
            do {
              uVar18 = pTVar12[lVar17]._content & 3;
              if (uVar18 == 0) {
                if ((*(byte *)(pTVar12[lVar17]._content + 0x28) & 8) == 0) break;
              }
              else if ((int)uVar18 == 3) break;
              lVar17 = lVar17 + 1;
              bVar22 = uVar11 <= (uint)lVar17;
            } while (uVar11 != (uint)lVar17);
          }
          if (!bVar22) goto LAB_0031e96a;
          if ((pTVar16->_args[0]._content & 0x20) == 0) {
            pTVar13 = Term::create(pTVar16,pTVar12);
          }
          else {
            pTVar13 = &AtomicSort::create((AtomicSort *)pTVar16,pTVar12)->super_Term;
          }
        }
        SVar20._M_t.
        super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
        ._M_t.
        super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
        .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl =
             local_80._self._M_t.
             super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
             .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl;
        pTVar12 = *(TermList **)
                   ((long)local_80._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl
                   + 8) + (((ulong)((long)*(TermList **)
                                           ((long)local_80._self._M_t.
                                                  super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                                  ._M_t.
                                                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                                  .
                                                  super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>
                                                  ._M_head_impl + 0x10) -
                                   (long)*(TermList **)
                                          ((long)local_80._self._M_t.
                                                 super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                                 ._M_t.
                                                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                                 .
                                                 super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>
                                                 ._M_head_impl + 8)) >> 3) -
                          (ulong)(*(uint *)&pTVar16->field_0xc & 0xfffffff));
        *(TermList **)
         ((long)local_80._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x10) =
             pTVar12;
        if (pTVar12 ==
            *(TermList **)
             ((long)local_80._self._M_t.
                    super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                    ._M_t.
                    super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                    .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
             0x18)) {
          ::Lib::Stack<Kernel::TermList>::expand
                    ((Stack<Kernel::TermList> *)
                     local_80._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl);
        }
        pTVar12 = *(TermList **)
                   ((long)SVar20._M_t.
                          super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                          .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl
                   + 0x10);
        pTVar12->_content = (uint64_t)pTVar13;
        *(TermList **)
         ((long)SVar20._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x10) =
             pTVar12 + 1;
        goto LAB_0031ea11;
      }
      pTVar12 = *(TermList **)
                 ((long)local_80._self._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
                 8) + (((ulong)((long)*(TermList **)
                                       ((long)local_80._self._M_t.
                                              super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                              ._M_t.
                                              super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                              .
                                              super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>
                                              ._M_head_impl + 0x10) -
                               (long)*(TermList **)
                                      ((long)local_80._self._M_t.
                                             super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                             ._M_t.
                                             super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                                             .
                                             super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>
                                             ._M_head_impl + 8)) >> 3) -
                      (ulong)(*(uint *)&pTVar16->field_0xc & 0xfffffff));
      *(TermList **)
       ((long)local_80._self._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x10) =
           pTVar12;
      if (pTVar12 ==
          *(TermList **)
           ((long)local_80._self._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x18)
         ) {
        ::Lib::Stack<Kernel::TermList>::expand
                  ((Stack<Kernel::TermList> *)
                   local_80._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl);
      }
LAB_0031ea89:
      pTVar12 = ((Stack<Kernel::TermList> *)
                SVar20._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl)->_cursor
      ;
      pTVar12->_content = (uint64_t)pTVar16;
      ((Stack<Kernel::TermList> *)
      SVar20._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl)->_cursor =
           pTVar12 + 1;
      goto LAB_0031e7d0;
    }
    if (ppTVar1 == *(TermList ***)(local_60._size + 0x18)) {
      ::Lib::Stack<Kernel::TermList_*>::expand((Stack<Kernel::TermList_*> *)local_60._size);
    }
    **(TermList ***)(sVar9 + 0x10) = pTVar12 + -1;
    pppTVar2 = (TermList ***)(sVar9 + 0x10);
    *pppTVar2 = *pppTVar2 + 1;
    pTVar16 = (Term *)pTVar12->_content;
    uVar11 = (uint)pTVar16 & 3;
    if (uVar11 == 3) {
      local_38._content = (uint64_t)((uint)pTVar16 | 3);
      pEVar15 = ::Lib::
                DHMap<Kernel::TermList,_Kernel::TermList,_Lib::DefaultHash,_Lib::DefaultHash2>::
                findEntry(&applicator->im->_derefBindings,&local_38);
      SVar20._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>,_true,_true>
            )(__uniq_ptr_data<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>,_true,_true>
              )local_80._self;
      TVar14._content = (pEVar15->_val)._content;
      if (*(TermList **)
           ((long)local_80._self._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x10)
          == *(TermList **)
              ((long)local_80._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
              0x18)) {
        ::Lib::Stack<Kernel::TermList>::expand
                  ((Stack<Kernel::TermList> *)
                   local_80._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl);
      }
      pTVar12 = *(TermList **)
                 ((long)SVar20._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
                 0x10);
      pTVar12->_content = TVar14._content;
      *(TermList **)
       ((long)SVar20._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x10) =
           pTVar12 + 1;
joined_r0x0031ea0b:
      if ((Term *)TVar14._content != pTVar16) {
LAB_0031ea11:
        (*(bool **)((long)local_70._self._M_t.
                          super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                          ._M_t.
                          super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                          .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10))
        [-1] = true;
      }
      goto LAB_0031e7d0;
    }
    if (uVar11 == 1) {
      TVar14 = Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::
               DerefApplicator::apply(applicator,(uint)((ulong)pTVar16 >> 2));
      SVar20._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>,_true,_true>
            )(__uniq_ptr_data<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>,_true,_true>
              )local_80._self;
      if (*(TermList **)
           ((long)local_80._self._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x10)
          == *(TermList **)
              ((long)local_80._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
              0x18)) {
        ::Lib::Stack<Kernel::TermList>::expand
                  ((Stack<Kernel::TermList> *)
                   local_80._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl);
      }
      pTVar12 = *(TermList **)
                 ((long)SVar20._M_t.
                        super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                        ._M_t.
                        super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                        .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
                 0x10);
      pTVar12->_content = TVar14._content;
      *(TermList **)
       ((long)SVar20._M_t.
              super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
              ._M_t.
              super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
              .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x10) =
           pTVar12 + 1;
      goto joined_r0x0031ea0b;
    }
    if ((((ulong)pTVar16 & 1) != 0) ||
       (((pTVar16->_args[0]._content & 8) != 0 && (uVar11 = Term::numVarOccs(pTVar16), uVar11 == 0))
       )) {
      SVar20._M_t.
      super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
      ._M_t.
      super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
      .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl =
           (__uniq_ptr_data<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>,_true,_true>
            )(__uniq_ptr_data<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>,_true,_true>
              )local_80._self;
      if (*(TermList **)
           ((long)local_80._self._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x10)
          == *(TermList **)
              ((long)local_80._self._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
              0x18)) {
        ::Lib::Stack<Kernel::TermList>::expand
                  ((Stack<Kernel::TermList> *)
                   local_80._self._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl);
      }
      goto LAB_0031ea89;
    }
    SVar10._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl =
         (__uniq_ptr_data<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>,_true,_true>
          )(__uniq_ptr_data<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>,_true,_true>
            )local_48._self;
    SVar20._M_t.
    super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
    ._M_t.
    super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
    .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl =
         (__uniq_ptr_data<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>,_true,_true>
          )(__uniq_ptr_data<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>,_true,_true>
            )local_80._self;
    if (0xfffffff8 < pTVar16->_functor) {
      pTVar16 = applyImpl<true,Indexing::SubstitutionTree<Inferences::ALASCA::Demodulation::Rhs>::InstMatcher::DerefApplicator>
                          (pTVar16,applicator,noSharing);
      if (*(TermList **)
           ((long)SVar20._M_t.
                  super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                  ._M_t.
                  super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                  .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl + 0x10)
          == *(TermList **)
              ((long)SVar20._M_t.
                     super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                     .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl +
              0x18)) {
        ::Lib::Stack<Kernel::TermList>::expand
                  ((Stack<Kernel::TermList> *)
                   SVar20._M_t.
                   super___uniq_ptr_impl<Lib::Stack<Kernel::TermList>,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                   ._M_t.
                   super__Tuple_impl<0UL,_Lib::Stack<Kernel::TermList>_*,_std::default_delete<Lib::Stack<Kernel::TermList>_>_>
                   .super__Head_base<0UL,_Lib::Stack<Kernel::TermList>_*,_false>._M_head_impl);
      }
      goto LAB_0031ea89;
    }
    if (*(Term ***)
         ((long)local_48._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl + 0x10) ==
        *(Term ***)
         ((long)local_48._self._M_t.
                super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                ._M_t.
                super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl + 0x18)) {
      ::Lib::Stack<Kernel::Term_*>::expand
                ((Stack<Kernel::Term_*> *)
                 local_48._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                 .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl);
    }
    SVar8._M_t.super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>._M_t
    .super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>.
    super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl =
         (__uniq_ptr_data<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>,_true,_true>)
         (__uniq_ptr_data<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>,_true,_true>)
         local_70._self;
    **(Term ***)
      ((long)SVar10._M_t.
             super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
             ._M_t.
             super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
             .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl + 0x10) =
         pTVar16;
    pppTVar3 = (Term ***)
               ((long)SVar10._M_t.
                      super___uniq_ptr_impl<Lib::Stack<Kernel::Term_*>,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                      ._M_t.
                      super__Tuple_impl<0UL,_Lib::Stack<Kernel::Term_*>_*,_std::default_delete<Lib::Stack<Kernel::Term_*>_>_>
                      .super__Head_base<0UL,_Lib::Stack<Kernel::Term_*>_*,_false>._M_head_impl +
               0x10);
    *pppTVar3 = *pppTVar3 + 1;
    if (*(bool **)((long)local_70._self._M_t.
                         super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                         .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10) ==
        *(bool **)((long)local_70._self._M_t.
                         super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                         ._M_t.
                         super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                         .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x18)) {
      ::Lib::Stack<bool>::expand
                ((Stack<bool> *)
                 local_70._self._M_t.
                 super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                 .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl);
    }
    pSVar19 = (Stack<Kernel::TermList_*> *)local_60._size;
    pbVar5 = *(bool **)((long)SVar8._M_t.
                              super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                              .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10)
    ;
    *pbVar5 = false;
    *(bool **)((long)SVar8._M_t.
                     super___uniq_ptr_impl<Lib::Stack<bool>,_std::default_delete<Lib::Stack<bool>_>_>
                     ._M_t.
                     super__Tuple_impl<0UL,_Lib::Stack<bool>_*,_std::default_delete<Lib::Stack<bool>_>_>
                     .super__Head_base<0UL,_Lib::Stack<bool>_*,_false>._M_head_impl + 0x10) =
         pbVar5 + 1;
    uVar11 = *(uint *)&pTVar16->field_0xc;
    if (*(TermList ***)(local_60._size + 0x10) == *(TermList ***)(local_60._size + 0x18)) {
      ::Lib::Stack<Kernel::TermList_*>::expand((Stack<Kernel::TermList_*> *)local_60._size);
    }
    pTVar12 = pTVar16->_args + (uVar11 & 0xfffffff);
  } while( true );
  do {
    uVar18 = pTVar12[lVar17]._content & 3;
    if (uVar18 == 0) {
      if ((*(byte *)(pTVar12[lVar17]._content + 0x28) & 8) == 0) break;
    }
    else if ((int)uVar18 == 3) break;
    lVar17 = lVar17 + 1;
    bVar22 = uVar11 <= (uint)lVar17;
  } while (uVar11 != (uint)lVar17);
LAB_0031ebb9:
  if (bVar22) {
    trm = Term::create(trm,pTVar12);
  }
  else {
LAB_0031ed56:
    trm = Term::createNonShared(trm,pTVar12);
  }
LAB_0031ed61:
  ::Lib::Recycled<Lib::Stack<Kernel::TermList>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_80);
  ::Lib::Recycled<Lib::Stack<bool>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::~Recycled
            (&local_70);
  ::Lib::Recycled<Lib::Stack<Kernel::Term_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled(&local_48);
  ::Lib::Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled>::
  ~Recycled((Recycled<Lib::Stack<Kernel::TermList_*>,_Lib::DefaultReset,_Lib::DefaultKeepRecycled> *
            )&local_60);
  return trm;
}

Assistant:

Term* SubstHelper::applyImpl(Term* trm, Applicator& applicator, bool noSharing)
{
  using namespace SubstHelper_Aux;

  if(trm->isSpecial()) {
    Term::SpecialTermData* sd = trm->getSpecialData();
    switch(trm->specialFunctor()) {
    case SpecialFunctor::ITE:
      return Term::createITE(
    applyImpl<ProcessSpecVars>(sd->getCondition(), applicator, noSharing),
    applyImpl<ProcessSpecVars>(*trm->nthArgument(0), applicator, noSharing),
    applyImpl<ProcessSpecVars>(*trm->nthArgument(1), applicator, noSharing),
    applyImpl<ProcessSpecVars>(sd->getSort(), applicator, noSharing)
    );
    case SpecialFunctor::LET:
      return Term::createLet(
    sd->getFunctor(),
    sd->getVariables(),
    applyImpl<ProcessSpecVars>(sd->getBinding(), applicator, noSharing),
    applyImpl<ProcessSpecVars>(*trm->nthArgument(0), applicator, noSharing),
    sd->getSort()
    );
    case SpecialFunctor::FORMULA:
      return Term::createFormula(
      applyImpl<ProcessSpecVars>(sd->getFormula(), applicator, noSharing)
      );
    case SpecialFunctor::LET_TUPLE:
      return Term::createTupleLet(
        sd->getFunctor(),
        sd->getTupleSymbols(),
        applyImpl<ProcessSpecVars>(sd->getBinding(), applicator, noSharing),
        applyImpl<ProcessSpecVars>(*trm->nthArgument(0), applicator, noSharing),
        sd->getSort()
        );
    case SpecialFunctor::TUPLE:
      return Term::createTuple(applyImpl<ProcessSpecVars>(sd->getTupleTerm(), applicator, noSharing));
    case SpecialFunctor::LAMBDA:
      // TODO in principle this should not be so difficult to handle
      ASSERTION_VIOLATION;
    case SpecialFunctor::MATCH: {
      DArray<TermList> terms(trm->arity());
      for (unsigned i = 0; i < trm->arity(); i++) {
        terms[i] = applyImpl<ProcessSpecVars>(*trm->nthArgument(i), applicator, noSharing);
      }
      return Term::createMatch(sd->getSort(), sd->getMatchedSort(), trm->arity(), terms.begin());
    }
    }
    ASSERTION_VIOLATION;
  }

  Recycled<Stack<TermList*>> toDo;
  Recycled<Stack<Term*>> terms;
  Recycled<Stack<bool>> modified;
  Recycled<Stack<TermList>> args;

  modified->push(false);
  toDo->push(trm->args());

  for(;;) {
    TermList* tt=toDo->pop();
    if(tt->isEmpty()) {
      if(terms->isEmpty()) {
        //we're done, args stack contains modified arguments
        //of the topleve term/literal.
        ASS(toDo->isEmpty());
        break;
      }
      Term* orig=terms->pop();
      if(!modified->pop()) {
        args->truncate(args->length() - orig->arity());
        args->push(TermList(orig));
        continue;
      }
      //here we assume, that stack is an array with
      //second topmost element as &top()-1, third at
      //&top()-2, etc...
      TermList* argLst=&args->top() - (orig->arity()-1);

      bool shouldShare=!noSharing && canBeShared(argLst, orig->arity());

      Term* newTrm;
      if(shouldShare) {
        if(orig->isSort()){
          newTrm=AtomicSort::create(static_cast<AtomicSort*>(orig), argLst);
        } else {
          newTrm=Term::create(orig,argLst);
        }
      }
      else {
        newTrm=Term::createNonShared(orig,argLst);
      }
      args->truncate(args->length() - orig->arity());
      args->push(TermList(newTrm));

      modified->setTop(true);
      continue;
    }
    toDo->push(tt->next());

    TermList tl=*tt;
    if(tl.isOrdinaryVar()) {
      TermList tDest=applicator.apply(tl.var());
      args->push(tDest);
      if(tDest!=tl) {
        modified->setTop(true);
      }
      continue;
    }
    if(tl.isSpecialVar()) {
      TermList tDest=SpecVarHandler<ProcessSpecVars>::apply(applicator,tl.var());
      args->push(tDest);
      if(tDest!=tl) {
        modified->setTop(true);
      }
      continue;
    }
    ASS(tl.isTerm());
    if(tl.isVar() || (tl.term()->shared() && tl.term()->ground())) {
      args->push(tl);
      continue;
    }
    Term* t = tl.term();
    if(t->isSpecial()) {
      //we handle specal terms at the top level of this function
      args->push(TermList(applyImpl<ProcessSpecVars>(t, applicator, noSharing)));
      continue;
    }
    terms->push(t);
    modified->push(false);
    toDo->push(t->args());
  }
  ASS(toDo->isEmpty());
  ASS(terms->isEmpty());
  ASS_EQ(modified->length(),1);
  ASS_EQ(args->length(),trm->arity());

  Term* result;
  if(!modified->pop()) {
    result=trm;
  }
  else {
    //here we assume, that stack is an array with
    //second topmost element as &top()-1, third at
    //&top()-2, etc...
    TermList* argLst=&args->top() - (trm->arity()-1);
    ASS_EQ(args->size(), trm->arity());
    if(trm->isLiteral()) {
      ASS(!noSharing);
      Literal* lit = static_cast<Literal*>(trm);
      result=Literal::create(lit,argLst);
    } else if(trm->isSort()){
      ASS(!noSharing);
      result=AtomicSort::create(static_cast<AtomicSort*>(trm),argLst);
    } else {
      bool shouldShare=!noSharing && canBeShared(argLst, trm->arity());
      if(shouldShare) {
        result=Term::create(trm,argLst);          
      } else {
        //At the memoent all sorts should be shared.
        result=Term::createNonShared(trm,argLst);
      }
    }
  }

  return result;
}